

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication_proxy.cpp
# Opt level: O3

void try_it(IPingable *p)

{
  ostream *poVar1;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"PING","");
  (*p->_vptr_IPingable[2])(&local_58,p,(string *)local_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_58,local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void try_it(IPingable& p)
{
	std::cout << p.ping("PING") << std::endl;
}